

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::LoadModifications(cmCTestSVN *this)

{
  undefined1 local_198 [8];
  OutputLogger err;
  StatusParser out;
  char *local_30;
  undefined1 local_28 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> svn_status;
  cmCTestSVN *this_local;
  
  svn_status.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  local_30 = "status";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,&local_30);
  StatusParser::StatusParser((StatusParser *)&err.super_LineParser.Separator,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_198,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "status-err> ");
  RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,
                (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_198);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_198);
  StatusParser::~StatusParser((StatusParser *)&err.super_LineParser.Separator);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  return;
}

Assistant:

void cmCTestSVN::LoadModifications()
{
  // Run "svn status" which reports local modifications.
  std::vector<const char*> svn_status;
  svn_status.push_back("status");
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunSVNCommand(svn_status, &out, &err);
}